

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAxyzDDD::ArchiveIN(ChNodeFEAxyzDDD *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  char *local_58;
  undefined ***local_50;
  undefined1 local_48;
  undefined **local_40;
  ChVector<double> *local_38;
  
  ChArchiveIn::VersionRead<chrono::fea::ChNodeFEAxyzDDD>(marchive);
  ChNodeFEAxyzDD::ArchiveIN(&this->super_ChNodeFEAxyzDD,marchive);
  local_38 = (ChVector<double> *)&(this->super_ChNodeFEAxyzDD).field_0x190;
  local_40 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_58 = "DDD";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->DDD_dt;
  local_40 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_58 = "DDD_dt";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->DDD_dtdt;
  local_40 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_58 = "DDD_dtdt";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  return;
}

Assistant:

void ChNodeFEAxyzDDD::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version = */ marchive.VersionRead<ChNodeFEAxyzDDD>();
    // deserialize parent class
    ChNodeFEAxyzDD::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(DDD);
    marchive >> CHNVP(DDD_dt);
    marchive >> CHNVP(DDD_dtdt);
}